

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::CheckTransformFeedbackBufferSize
          (FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  unsigned_long local_1c0 [3];
  MessageBuilder local_1a8;
  GLint64 local_28;
  GLint64 size;
  Functions *gl;
  FunctionalTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  size = CONCAT44(extraout_var,iVar1);
  local_28 = -1;
  (*this->m_pGetNamedBufferParameteri64v)(this->m_bo_out,0x8764,&local_28);
  iVar1 = (**(code **)(size + 0x800))();
  if (iVar1 == 0) {
    if (local_28 == -1) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_340,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_340,
                          (char (*) [53])"GetNamedBufferParameteri64v has not returned a data.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_340);
    }
    else {
      if (local_28 == 0x1c) {
        return true;
      }
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_1a8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [23])"Output buffer size is ");
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_28);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])0x2a796ef);
      local_1c0[0] = 0x1c;
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c0);
      pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [15])0x2a7d12b);
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1a8);
    }
  }
  else {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_4c0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<
                       (&local_4c0,(char (*) [40])"GetNamedBufferParameteri64v has failed.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4c0);
  }
  return false;
}

Assistant:

bool FunctionalTest::CheckTransformFeedbackBufferSize()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Local query storage. */
	glw::GLint64 size = -1;

	/* Querry. */
	m_pGetNamedBufferParameteri64v(m_bo_out, GL_BUFFER_SIZE, &size);

	/* Error checking. */
	if (GL_NO_ERROR == gl.getError())
	{
		/* Return value checking. */
		if (-1 != size)
		{
			/* Test. */
			if (sizeof(s_initial_data_b) == size)
			{
				return true;
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Output buffer size is " << size
													<< ", but " << sizeof(s_initial_data_b) << " was expected."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "GetNamedBufferParameteri64v has not returned a data."
												<< tcu::TestLog::EndMessage;
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GetNamedBufferParameteri64v has failed."
											<< tcu::TestLog::EndMessage;
	}

	return false;
}